

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::Read(cmELFInternalImpl<cmELFTypes32> *this,ELF_Ehdr *x)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  
  plVar4 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream,(long)x);
  uVar2 = *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20);
  if ((uVar2 & 5) == 0) {
    uVar1 = x->e_type;
    uVar6 = (uint)uVar1;
    bVar3 = (this->super_cmELFInternal).NeedSwap;
    uVar5 = (uint)(uVar1 >> 8);
    if ((bool)bVar3 == false) {
      uVar5 = (uint)uVar1;
      uVar6 = (uint)(uVar1 >> 8);
    }
    if ((((uVar6 & 0xff) != 0xfe) &&
        (uVar5 = uVar5 & 0xff, 0x104 < (uVar6 * 0x100 + uVar5 + 0x100 & 0xffff))) &&
       ((uVar5 == 0xfe || ((uVar5 * 0x100 + (uVar6 & 0xff) + 0x100 & 0xffff) < 0x105)))) {
      bVar3 = bVar3 ^ 1;
      (this->super_cmELFInternal).NeedSwap = (bool)bVar3;
    }
    if (bVar3 != 0) {
      ByteSwap(this,x);
    }
  }
  return (uVar2 & 5) == 0;
}

Assistant:

bool Read(ELF_Ehdr& x)
  {
    // Read the header from the file.
    if (!this->Stream.read(reinterpret_cast<char*>(&x), sizeof(x))) {
      return false;
    }

    // The byte order of ELF header fields may not match that of the
    // processor-specific data.  The header fields are ordered to
    // match the target execution environment, so we may need to
    // memorize the order of all platforms based on the e_machine
    // value.  As a heuristic, if the type is invalid but its
    // swapped value is okay then flip our swap mode.
    ELF_Half et = x.e_type;
    if (this->NeedSwap) {
      cmELFByteSwap(et);
    }
    if (!this->FileTypeValid(et)) {
      cmELFByteSwap(et);
      if (this->FileTypeValid(et)) {
        // The previous byte order guess was wrong.  Flip it.
        this->NeedSwap = !this->NeedSwap;
      }
    }

    // Fix the byte order of the header.
    if (this->NeedSwap) {
      ByteSwap(x);
    }
    return true;
  }